

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void R_DrawVisSprite(vissprite_t *vis)

{
  bool bVar1;
  int iVar2;
  bool local_5d;
  int local_5c;
  int zz;
  fixed_t centeryfrac;
  bool local_41;
  ESPSResult local_40;
  int iStack_3c;
  bool ispsprite;
  ESPSResult mode;
  fixed_t xiscale;
  int stop4;
  int x2;
  FTexture *tex;
  Span *pSStack_20;
  fixed_t frac;
  Span *spans;
  BYTE *pixels;
  vissprite_t *vis_local;
  
  local_5d = false;
  pixels = (BYTE *)vis;
  if (vis->sector == (sector_t *)0x0) {
    TVector3<float>::TVector3((TVector3<float> *)&stack0xffffffffffffffb0,0.0,0.0,0.0);
    local_5d = TVector3<float>::operator!=(&vis->gpos,(TVector3<float> *)&stack0xffffffffffffffb0);
  }
  local_41 = local_5d;
  if ((*(int *)(pixels + 0x20) != 0) &&
     ((*(float *)(pixels + 0x24) != 0.0 || (NAN(*(float *)(pixels + 0x24)))))) {
    FloatToFixed(CenterY);
    dc_colormap = *(lighttable_t **)(pixels + 0xa0);
    local_40 = R_SetPatchStyle(*(FRenderStyle *)(pixels + 0xac),*(float *)(pixels + 0xa8),
                               *(int *)(pixels + 0x98),*(DWORD *)(pixels + 0x38));
    bVar1 = FRenderStyle::operator==((FRenderStyle *)(pixels + 0xac),LegacyRenderStyles + 8);
    if (bVar1) {
      dc_colormap = dc_colormap + (int)((uint)pixels[0x92] << 8);
    }
    if (local_40 != DontDraw) {
      if (local_40 == DoDraw0) {
        mode = (ESPSResult)*(short *)pixels;
      }
      else {
        mode = (int)*(short *)(pixels + 2) & ~(DoDraw1|DoDraw0);
      }
      _stop4 = *(long **)(pixels + 0x48);
      spryscale = (double)*(float *)(pixels + 0x24);
      sprflipvert = false;
      dc_iscale = FloatToFixed((double)(1.0 / *(float *)(pixels + 0x24)));
      tex._4_4_ = *(int *)(pixels + 0x58);
      iStack_3c = *(int *)(pixels + 0x5c);
      dc_texturemid = *(double *)(pixels + 0x50);
      if ((*(ushort *)(pixels + 0x94) & 2) == 0) {
        sprflipvert = false;
        sprtopscreen = CenterY - dc_texturemid * spryscale;
      }
      else {
        sprflipvert = true;
        spryscale = -spryscale;
        dc_iscale = -dc_iscale;
        iVar2 = FTexture::GetHeight(*(FTexture **)(pixels + 0x48));
        dc_texturemid = dc_texturemid - (double)iVar2;
        sprtopscreen = CenterY + dc_texturemid * spryscale;
      }
      dc_x = (int)*(short *)pixels;
      xiscale = (fixed_t)*(short *)(pixels + 2);
      if (dc_x < xiscale) {
        for (; dc_x < (int)mode && (dc_x & 3U) != 0; dc_x = dc_x + 1) {
          spans = (Span *)(**(code **)(*_stop4 + 0x10))
                                    (_stop4,tex._4_4_ >> 0x10,&stack0xffffffffffffffe0);
          if (((local_41 & 1U) != 0) ||
             (bVar1 = R_ClipSpriteColumnWithPortals((vissprite_t *)pixels), !bVar1)) {
            R_DrawMaskedColumn((BYTE *)spans,pSStack_20);
          }
          tex._4_4_ = iStack_3c + tex._4_4_;
        }
        while (dc_x < (int)mode) {
          rt_initcols((BYTE *)0x0);
          for (local_5c = 4; local_5c != 0; local_5c = local_5c + -1) {
            spans = (Span *)(**(code **)(*_stop4 + 0x10))
                                      (_stop4,tex._4_4_ >> 0x10,&stack0xffffffffffffffe0);
            if (((local_41 & 1U) != 0) ||
               (bVar1 = R_ClipSpriteColumnWithPortals((vissprite_t *)pixels), !bVar1)) {
              R_DrawMaskedColumnHoriz((BYTE *)spans,pSStack_20);
            }
            dc_x = dc_x + 1;
            tex._4_4_ = iStack_3c + tex._4_4_;
          }
          rt_draw4cols(dc_x + -4);
        }
        for (; dc_x < xiscale; dc_x = dc_x + 1) {
          spans = (Span *)(**(code **)(*_stop4 + 0x10))
                                    (_stop4,tex._4_4_ >> 0x10,&stack0xffffffffffffffe0);
          if (((local_41 & 1U) != 0) ||
             (bVar1 = R_ClipSpriteColumnWithPortals((vissprite_t *)pixels), !bVar1)) {
            R_DrawMaskedColumn((BYTE *)spans,pSStack_20);
          }
          tex._4_4_ = iStack_3c + tex._4_4_;
        }
      }
    }
    R_FinishSetPatchStyle();
    NetUpdate();
  }
  return;
}

Assistant:

void R_DrawVisSprite (vissprite_t *vis)
{
	const BYTE *pixels;
	const FTexture::Span *spans;
	fixed_t 		frac;
	FTexture		*tex;
	int				x2, stop4;
	fixed_t			xiscale;
	ESPSResult		mode;
	bool			ispsprite = (!vis->sector && vis->gpos != FVector3(0, 0, 0));

	if (vis->xscale == 0 || vis->yscale == 0)
	{ // scaled to 0; can't see
		return;
	}

	fixed_t centeryfrac = FLOAT2FIXED(CenterY);
	dc_colormap = vis->Style.colormap;

	mode = R_SetPatchStyle (vis->Style.RenderStyle, vis->Style.Alpha, vis->Translation, vis->FillColor);

	if (vis->Style.RenderStyle == LegacyRenderStyles[STYLE_Shaded])
	{ // For shaded sprites, R_SetPatchStyle sets a dc_colormap to an alpha table, but
	  // it is the brightest one. We need to get back to the proper light level for
	  // this sprite.
		dc_colormap += vis->ColormapNum << COLORMAPSHIFT;
	}

	if (mode != DontDraw)
	{
		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = vis->x1;
		}
		else	 // DoDraw1
		{
			// Up to four columns at a time
			stop4 = vis->x2 & ~3;
		}

		tex = vis->pic;
		spryscale = vis->yscale;
		sprflipvert = false;
		dc_iscale = FLOAT2FIXED(1 / vis->yscale);
		frac = vis->startfrac;
		xiscale = vis->xiscale;
		dc_texturemid = vis->texturemid;

		if (vis->renderflags & RF_YFLIP)
		{
			sprflipvert = true;
			spryscale = -spryscale;
			dc_iscale = -dc_iscale;
			dc_texturemid -= vis->pic->GetHeight();
			sprtopscreen = CenterY + dc_texturemid * spryscale;
		}
		else
		{
			sprflipvert = false;
			sprtopscreen = CenterY - dc_texturemid * spryscale;
		}

		dc_x = vis->x1;
		x2 = vis->x2;

		if (dc_x < x2)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					pixels = tex->GetColumn (frac >> FRACBITS, &spans);
					if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
						R_DrawMaskedColumnHoriz (pixels, spans);
					dc_x++;
					frac += xiscale;
				}
				rt_draw4cols (dc_x - 4);
			}

			while (dc_x < x2)
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}
		}
	}

	R_FinishSetPatchStyle ();

	NetUpdate ();
}